

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_op.hpp
# Opt level: O3

void asio::detail::
     executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
     ::do_complete(void *owner,scheduler_operation *base,error_code *param_3,size_t param_4)

{
  scheduler_operation *psVar1;
  code *pcVar2;
  allocator<void> allocator;
  binder0<std::function<void_()>_> handler;
  ptr p;
  allocator<void> local_59;
  scheduler_operation *local_58;
  func_type p_Stack_50;
  code *local_48;
  scheduler_operation *local_40;
  ptr local_30;
  
  local_30.a = &local_59;
  local_58 = (scheduler_operation *)0x0;
  p_Stack_50 = (func_type)0x0;
  local_48 = (code *)0x0;
  psVar1 = base[2].next_;
  pcVar2 = *(code **)&base[1].task_result_;
  if (pcVar2 != (code *)0x0) {
    local_58 = base[1].next_;
    p_Stack_50 = base[1].func_;
    *(undefined8 *)&base[1].task_result_ = 0;
    base[2].next_ = (scheduler_operation *)0x0;
    local_48 = pcVar2;
  }
  local_40 = psVar1;
  local_30.v = base;
  local_30.p = (executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
                *)base;
  ptr::reset(&local_30);
  if (owner != (void *)0x0) {
    if (pcVar2 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    (*(code *)psVar1)(&local_58);
    pcVar2 = local_48;
  }
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(&local_58,&local_58,3);
  }
  ptr::reset(&local_30);
  return;
}

Assistant:

static void do_complete(void* owner, Operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    executor_op* o(static_cast<executor_op*>(base));
    Alloc allocator(o->allocator_);
    ptr p = { detail::addressof(allocator), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(o->handler_));
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      asio_handler_invoke_helpers::invoke(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }